

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty_needle_removal.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::EmptyNeedleRemovalRule::Apply
          (EmptyNeedleRemovalRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  Expression *expr;
  int iVar1;
  reference pvVar2;
  BoundFunctionExpression *pBVar3;
  ClientContext *context;
  BoundConstantExpression *this_00;
  string *psVar4;
  reference pvVar5;
  Value prefix_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_140;
  LogicalType local_138;
  Value local_120;
  Value local_e0;
  Value local_a0;
  Value local_60;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar2->_M_data->super_BaseExpression);
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  expr = pvVar2->_M_data;
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar1 != '\0') {
    context = Rule::GetContext((Rule *)op);
    ExpressionExecutor::EvaluateScalar(&local_120,context,expr,false);
    if (local_120.is_null == true) {
      LogicalType::LogicalType(&local_138,BOOLEAN);
      Value::Value(&local_a0,&local_138);
      this_00 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value(&local_60,&local_a0);
      BoundConstantExpression::BoundConstantExpression(this_00,&local_60);
      Value::~Value(&local_60);
      (this->super_Rule)._vptr_Rule = (_func_int **)this_00;
      Value::~Value(&local_a0);
      LogicalType::~LogicalType(&local_138);
    }
    else if ((local_120.type_.physical_type_ == VARCHAR) &&
            (psVar4 = StringValue::Get_abi_cxx11_(&local_120), psVar4->_M_string_length == 0)) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&pBVar3->children,0);
      local_140._M_head_impl =
           (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      Value::BOOLEAN(&local_e0,true);
      ExpressionRewriter::ConstantOrNull
                ((ExpressionRewriter *)this,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_140,&local_e0);
      Value::~Value(&local_e0);
      if (local_140._M_head_impl != (Expression *)0x0) {
        (*((local_140._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_140._M_head_impl = (Expression *)0x0;
    }
    else {
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    Value::~Value(&local_120);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> EmptyNeedleRemovalRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                     bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	D_ASSERT(root.children.size() == 2);
	auto &prefix_expr = bindings[2].get();

	// the constant_expr is a scalar expression that we have to fold
	if (!prefix_expr.IsFoldable()) {
		return nullptr;
	}
	D_ASSERT(root.return_type.id() == LogicalTypeId::BOOLEAN);

	auto prefix_value = ExpressionExecutor::EvaluateScalar(GetContext(), prefix_expr);

	if (prefix_value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(LogicalType::BOOLEAN));
	}

	D_ASSERT(prefix_value.type() == prefix_expr.return_type);
	if (prefix_value.type().InternalType() != PhysicalType::VARCHAR) {
		return nullptr;
	}
	auto &needle_string = StringValue::Get(prefix_value);

	// PREFIX('xyz', '') is TRUE
	// PREFIX(NULL, '') is NULL
	// so rewrite PREFIX(x, '') to TRUE_OR_NULL(x)
	if (needle_string.empty()) {
		return ExpressionRewriter::ConstantOrNull(std::move(root.children[0]), Value::BOOLEAN(true));
	}
	return nullptr;
}